

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O1

UndoBufferProperties __thiscall duckdb::UndoBuffer::GetProperties(UndoBuffer *this)

{
  int iVar1;
  uint uVar2;
  BufferManager *pBVar3;
  int *piVar4;
  bool bVar5;
  DuckIndexEntry *index;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> _Var6;
  CatalogEntry *pCVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  UndoBufferProperties UVar11;
  IteratorState iterator_state;
  BufferHandle local_80;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_68;
  int *local_60;
  int *local_58;
  UndoBuffer *local_50;
  BufferHandle local_48;
  
  _Var6._M_head_impl =
       (this->allocator).head.
       super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
       .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
  iVar8 = 0;
  if (_Var6._M_head_impl == (UndoBufferEntry *)0x0) {
    uVar10 = 0;
  }
  else {
    do {
      iVar8 = iVar8 + *(idx_t *)((long)_Var6._M_head_impl + 0x18);
      _Var6._M_head_impl =
           *(UndoBufferEntry **)
            &((unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>,_true>
               *)((long)_Var6._M_head_impl + 0x28))->
             super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
      ;
    } while ((tuple<duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>)
             _Var6._M_head_impl != (_Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>)0x0);
    local_50 = this;
    BufferHandle::BufferHandle(&local_80);
    local_68.ptr = (local_50->allocator).tail.ptr;
    if (local_68.ptr == (UndoBufferEntry *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      do {
        pBVar3 = (local_50->allocator).buffer_manager;
        optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_68);
        (*pBVar3->_vptr_BufferManager[7])(&local_48,pBVar3,&(local_68.ptr)->block);
        BufferHandle::operator=(&local_80,&local_48);
        BufferHandle::~BufferHandle(&local_48);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_80.node);
        piVar4 = (int *)(local_80.node.ptr)->buffer;
        local_60 = piVar4;
        optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_68);
        local_58 = (int *)((long)piVar4 + (local_68.ptr)->position);
        uVar9 = uVar10;
        if (local_60 < local_58) {
          do {
            iVar1 = *local_60;
            uVar2 = local_60[1];
            piVar4 = local_60 + 2;
            if (iVar1 == 1) {
              local_60 = piVar4;
              pCVar7 = CatalogEntry::Parent(*(CatalogEntry **)piVar4);
              uVar10 = uVar9 & 0xffffffff00ffffff | 0x1000000;
              if (pCVar7->type == INDEX_ENTRY) {
                iVar8 = iVar8 + pCVar7[2].timestamp.super___atomic_base<unsigned_long>._M_i;
              }
              else if (pCVar7->type == DELETED_ENTRY) {
                uVar10 = uVar9 & 0xffffff0000ffffff | 0x101000000;
              }
            }
            else if (iVar1 == 3) {
              if ((char)local_60[0xc] == '\x01') {
                iVar8 = iVar8 + *(long *)(local_60 + 8) * 8;
              }
              local_60 = piVar4;
              bVar5 = DataTable::HasIndexes(*(DataTable **)piVar4);
              uVar10 = uVar9 & 0xffffffffff0000ff | 0x10000;
              if (!bVar5) {
                uVar10 = uVar9;
              }
              uVar10 = uVar10 & 0xffffffffffff00ff | 0x100;
            }
            else {
              uVar10 = uVar9;
              local_60 = piVar4;
              if (iVar1 == 4) {
                uVar10 = (uVar9 & 0xffffffffffffff00) + 1;
              }
            }
            local_60 = (int *)((ulong)uVar2 + (long)local_60);
            uVar9 = uVar10;
          } while (local_60 < local_58);
        }
        optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_68);
        local_68.ptr = ((local_68.ptr)->prev).ptr;
      } while (local_68.ptr != (UndoBufferEntry *)0x0);
    }
    local_68.ptr = (UndoBufferEntry *)0x0;
    BufferHandle::~BufferHandle(&local_80);
  }
  UVar11.has_updates = (bool)(char)uVar10;
  UVar11.has_deletes = (bool)(char)(uVar10 >> 8);
  UVar11.has_index_deletes = (bool)(char)(uVar10 >> 0x10);
  UVar11.has_catalog_changes = (bool)(char)(uVar10 >> 0x18);
  UVar11.has_dropped_entries = (bool)(char)(uVar10 >> 0x20);
  UVar11._13_3_ = (int3)(uVar10 >> 0x28);
  UVar11.estimated_size = iVar8;
  return UVar11;
}

Assistant:

UndoBufferProperties UndoBuffer::GetProperties() {
	UndoBufferProperties properties;
	if (!ChangesMade()) {
		return properties;
	}
	auto node = allocator.head.get();
	while (node) {
		properties.estimated_size += node->position;
		node = node->next.get();
	}

	// we need to search for any index creation entries
	IteratorState iterator_state;
	IterateEntries(iterator_state, [&](UndoFlags entry_type, data_ptr_t data) {
		switch (entry_type) {
		case UndoFlags::UPDATE_TUPLE:
			properties.has_updates = true;
			break;
		case UndoFlags::DELETE_TUPLE: {
			auto info = reinterpret_cast<DeleteInfo *>(data);
			if (info->is_consecutive) {
				properties.estimated_size += sizeof(row_t) * info->count;
			}
			if (info->table->HasIndexes()) {
				properties.has_index_deletes = true;
			}
			properties.has_deletes = true;
			break;
		}
		case UndoFlags::CATALOG_ENTRY: {
			properties.has_catalog_changes = true;

			auto catalog_entry = Load<CatalogEntry *>(data);
			auto &parent = catalog_entry->Parent();
			switch (parent.type) {
			case CatalogType::DELETED_ENTRY:
				properties.has_dropped_entries = true;
				break;
			case CatalogType::INDEX_ENTRY: {
				auto &index = parent.Cast<DuckIndexEntry>();
				properties.estimated_size += index.initial_index_size;
				break;
			}
			default:
				break;
			}
			break;
		}
		default:
			break;
		}
	});
	return properties;
}